

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilBitMatrix.c
# Opt level: O2

int Extra_BitMatrixIsDisjoint(Extra_BitMat_t *p1,Extra_BitMat_t *p2)

{
  uint *puVar1;
  uint *puVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar3 = p1->nSize;
  if (uVar3 != p2->nSize) {
    __assert_fail("p1->nSize == p2->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/extra/extraUtilBitMatrix.c"
                  ,0x174,"int Extra_BitMatrixIsDisjoint(Extra_BitMat_t *, Extra_BitMat_t *)");
  }
  uVar4 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar4 = 0;
  }
  uVar5 = 0;
  do {
    if (uVar5 == uVar4) {
      return 1;
    }
    uVar6 = (ulong)(uint)p1->nWords;
    if (p1->nWords < 1) {
      uVar6 = 0;
    }
    uVar7 = 0;
    while (uVar6 != uVar7) {
      puVar1 = p2->ppData[uVar5] + uVar7;
      puVar2 = p1->ppData[uVar5] + uVar7;
      uVar7 = uVar7 + 1;
      if ((*puVar2 & *puVar1) != 0) {
        return 0;
      }
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

int Extra_BitMatrixIsDisjoint( Extra_BitMat_t * p1, Extra_BitMat_t * p2 )
{
    int i, w;
    assert( p1->nSize == p2->nSize );
    for ( i = 0; i < p1->nSize; i++ )
        for ( w = 0; w < p1->nWords; w++ )
            if ( p1->ppData[i][w] & p2->ppData[i][w] )
                return 0;
    return 1;
}